

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O0

void __thiscall
wasm::
WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
::runOnFunction(WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                *this,Module *module,Function *func)

{
  PassRunner *pPVar1;
  Function *func_local;
  Module *module_local;
  WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
  *this_local;
  
  pPVar1 = Pass::getPassRunner(&this->super_Pass);
  if (pPVar1 != (PassRunner *)0x0) {
    Walker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>_>
    ::walkFunctionInModule
              ((Walker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>_>
                *)&this->
                   super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
               ,func,module);
    return;
  }
  __assert_fail("getPassRunner()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/pass.h"
                ,0x223,
                "virtual void wasm::WalkerPass<wasm::CFGWalker<wasm::(anonymous namespace)::Optimizer, wasm::Visitor<wasm::(anonymous namespace)::Optimizer>, wasm::(anonymous namespace)::BlockInfo>>::runOnFunction(Module *, Function *) [WalkerType = wasm::CFGWalker<wasm::(anonymous namespace)::Optimizer, wasm::Visitor<wasm::(anonymous namespace)::Optimizer>, wasm::(anonymous namespace)::BlockInfo>]"
               );
}

Assistant:

void runOnFunction(Module* module, Function* func) override {
    assert(getPassRunner());
    WalkerType::walkFunctionInModule(func, module);
  }